

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LennardJonesAdapter.cpp
# Opt level: O1

LJAtypeParameters * __thiscall
OpenMD::LennardJonesAdapter::getLJParam
          (LJAtypeParameters *__return_storage_ptr__,LennardJonesAdapter *this)

{
  RealType RVar1;
  bool bVar2;
  long lVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<OpenMD::GenericData> data;
  undefined1 local_58 [16];
  string local_48;
  
  bVar2 = AtomType::hasProperty(this->at_,(string *)LJtypeID_abi_cxx11_);
  if (!bVar2) {
    AtomType::getName_abi_cxx11_(&local_48,this->at_);
    snprintf(painCave.errMsg,2000,
             "LennardJonesAdapter::getLJParam was passed an atomType (%s)\n\tthat does not appear to be a Lennard-Jones atom.\n"
             ,local_48._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  AtomType::getPropertyByName((AtomType *)local_58,(string *)this->at_);
  if ((_func_int **)local_58._0_8_ == (_func_int **)0x0) {
    AtomType::getName_abi_cxx11_(&local_48,this->at_);
    snprintf(painCave.errMsg,2000,
             "LennardJonesAdapter::getLJParam could not find Lennard-Jones\n\tparameters for atomType %s.\n"
             ,local_48._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  if ((_func_int **)local_58._0_8_ == (_func_int **)0x0) {
    lVar3 = 0;
  }
  else {
    lVar3 = __dynamic_cast(local_58._0_8_,&GenericData::typeinfo,
                           &SimpleTypeData<OpenMD::LJAtypeParameters>::typeinfo,0);
  }
  if (lVar3 == 0) {
    lVar3 = 0;
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_58._8_8_ + 8) = *(_Atomic_word *)(local_58._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_58._8_8_ + 8) = *(_Atomic_word *)(local_58._8_8_ + 8) + 1;
      }
    }
  }
  if (lVar3 == 0) {
    AtomType::getName_abi_cxx11_(&local_48,this->at_);
    snprintf(painCave.errMsg,2000,
             "LennardJonesAdapter::getLJParam could not convert\n\tGenericData to LJAtypeData for atom type %s\n"
             ,local_48._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  *(undefined8 *)&__return_storage_ptr__->isSoft = *(undefined8 *)(lVar3 + 0x38);
  RVar1 = *(RealType *)(lVar3 + 0x30);
  __return_storage_ptr__->sigma = *(RealType *)(lVar3 + 0x28);
  __return_storage_ptr__->epsilon = RVar1;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

LJAtypeParameters LennardJonesAdapter::getLJParam() {
    if (!isLennardJones()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "LennardJonesAdapter::getLJParam was passed an atomType (%s)\n"
               "\tthat does not appear to be a Lennard-Jones atom.\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<GenericData> data = at_->getPropertyByName(LJtypeID);
    if (data == nullptr) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "LennardJonesAdapter::getLJParam could not find Lennard-Jones\n"
               "\tparameters for atomType %s.\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<LJAtypeData> ljData =
        std::dynamic_pointer_cast<LJAtypeData>(data);
    if (ljData == nullptr) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "LennardJonesAdapter::getLJParam could not convert\n"
               "\tGenericData to LJAtypeData for atom type %s\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    return ljData->getData();
  }